

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O3

void Dau_NetworkEnum(int nVars)

{
  byte *pbVar1;
  bool bVar2;
  Vec_Int_t *pVVar3;
  bool bVar4;
  int v;
  int iVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  uint *pTable;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  Vec_Int_t *vNpns_;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  Vec_Int_t *pVVar16;
  long lVar17;
  int SuppSize;
  Vec_Int_t *pVVar18;
  __time_t *p_Var19;
  timespec *ptVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  timespec ts_1;
  word *tLimit;
  char pFileName [200];
  timespec local_1a0;
  Vec_Int_t *local_190;
  int local_184;
  long local_180;
  Vec_Int_t *local_178;
  ulong local_170;
  word *local_168;
  ulong local_160;
  undefined8 local_158;
  long local_150;
  long local_148;
  timespec *local_140;
  ulong local_138;
  long local_130;
  word *local_128;
  long local_120;
  ulong local_118;
  long local_110;
  long local_108;
  long local_100;
  timespec local_f8 [12];
  
  iVar5 = clock_gettime(3,local_f8);
  if (iVar5 < 0) {
    local_180 = -1;
  }
  else {
    local_180 = local_f8[0].tv_nsec / 1000 + local_f8[0].tv_sec * 1000000;
  }
  pVVar6 = (Vec_Int_t *)calloc(0x20,0x10);
  pVVar7 = (Vec_Int_t *)calloc(0x20,0x10);
  uVar11 = nVars - 1;
  if (6 < uVar11) {
    __assert_fail("nBits >= 0 && nBits <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xc2,"word Abc_Tt6Mask(int)");
  }
  uVar15 = 1 << ((char)(1 << ((byte)nVars & 0x1f)) - 2U & 0x1f);
  pVVar16 = (Vec_Int_t *)(ulong)uVar15;
  uVar14 = 0xffffffffffffffff >> ((byte)(-1 << ((byte)uVar11 & 0x1f)) & 0x3f);
  sprintf((char *)local_f8,"tableW%d.data");
  pTable = Dau_ReadFile((char *)local_f8,uVar15);
  *(byte *)((long)pTable + 3) = *(byte *)((long)pTable + 3) | 0x80;
  iVar5 = (int)uVar14;
  pbVar1 = (byte *)((long)pTable + (uVar14 & 0xffffffff) * 4 + 3);
  *pbVar1 = *pbVar1 | 0x80;
  Vec_IntPush(pVVar6,0);
  Vec_IntPush(pVVar6,iVar5);
  Vec_IntPush(pVVar7,0);
  local_190 = pVVar7;
  Vec_IntPush(pVVar7,iVar5);
  iVar5 = 0;
  iVar26 = 0;
  iVar28 = 0;
  iVar30 = 0;
  lVar8 = 0x34;
  do {
    iVar5 = iVar5 + *(int *)((long)&pVVar6[-3].nCap + lVar8);
    iVar26 = iVar26 + *(int *)((long)&pVVar6[-2].nCap + lVar8);
    iVar28 = iVar28 + *(int *)((long)&pVVar6[-1].nCap + lVar8);
    iVar30 = iVar30 + *(int *)((long)&pVVar6->nCap + lVar8);
    lVar8 = lVar8 + 0x40;
  } while (lVar8 != 0x234);
  iVar25 = 0;
  iVar27 = 0;
  iVar29 = 0;
  iVar31 = 0;
  lVar8 = 0x34;
  do {
    iVar25 = iVar25 + *(int *)((long)&local_190[-3].nCap + lVar8);
    iVar27 = iVar27 + *(int *)((long)&local_190[-2].nCap + lVar8);
    iVar29 = iVar29 + *(int *)((long)&local_190[-1].nCap + lVar8);
    iVar31 = iVar31 + *(int *)((long)&local_190->nCap + lVar8);
    lVar8 = lVar8 + 0x40;
  } while (lVar8 != 0x234);
  local_178 = pVVar6;
  printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ",0,
         (ulong)(uint)pVVar6->nSize,iVar30 + iVar26 + iVar28 + iVar5,(ulong)(uint)local_190->nSize,
         iVar31 + iVar27 + iVar29 + iVar25);
  iVar26 = 3;
  iVar5 = clock_gettime(3,&local_1a0);
  if (iVar5 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_1a0.tv_nsec / 1000 + local_1a0.tv_sec * 1000000;
  }
  lVar8 = lVar8 - local_180;
  Abc_Print(iVar26,"%s =","Time");
  Abc_Print(iVar26,"%9.2f sec\n",(double)lVar8 / 1000000.0);
  pVVar3 = local_178;
  pVVar7 = local_190;
  local_184 = nVars + -6;
  local_140 = (timespec *)(&local_1a0.tv_sec + (1 << ((byte)(nVars + -6) & 0x1f)));
  local_138 = (ulong)(uint)nVars;
  local_160 = (ulong)uVar11;
  local_128 = s_Truths6 + uVar11;
  local_158 = 1;
  pVVar6 = local_178 + 1;
  vNpns_ = local_190 + 1;
  iVar5 = local_178->nSize;
  if (0 < iVar5) {
    lVar8 = 0;
    do {
      local_148 = lVar8;
      local_1a0.tv_sec = (long)pVVar3->pArray[lVar8] << 0x20 | (long)pVVar3->pArray[lVar8];
      uVar14 = 0;
      uVar15 = 0;
      do {
        if ((uint)nVars < 7) {
LAB_0051a00a:
          if ((s_Truths6Neg[uVar14] &
              ((ulong)local_1a0.tv_sec >> ((byte)(1 << ((byte)uVar14 & 0x1f)) & 0x3f) ^
              local_1a0.tv_sec)) != 0) {
LAB_0051a02b:
            uVar15 = uVar15 + 1;
          }
        }
        else if (uVar14 < 6) {
          if (local_184 != 0x1f) goto LAB_0051a00a;
        }
        else if (local_184 != 0x1f) {
          bVar10 = (byte)(uVar14 - 6);
          uVar12 = 1 << (bVar10 & 0x1f);
          iVar26 = 2 << (bVar10 & 0x1f);
          uVar13 = 1;
          if (1 < (int)uVar12) {
            uVar13 = (ulong)uVar12;
          }
          p_Var19 = &local_1a0.tv_sec + (int)uVar12;
          ptVar20 = &local_1a0;
          do {
            if (uVar14 - 6 != 0x1f) {
              uVar9 = 0;
              do {
                if ((&ptVar20->tv_sec)[uVar9] != p_Var19[uVar9]) goto LAB_0051a02b;
                uVar9 = uVar9 + 1;
              } while (uVar13 != uVar9);
            }
            ptVar20 = (timespec *)(&ptVar20->tv_sec + iVar26);
            p_Var19 = p_Var19 + iVar26;
          } while (ptVar20 < local_140);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_138);
      uVar12 = 6;
      if (uVar15 == 6) {
LAB_0051a0ff:
        local_130 = (long)(int)(uVar11 - uVar12);
        uVar13 = (ulong)uVar12;
        local_120 = -uVar13;
        local_150 = 0;
        uVar14 = 0;
        do {
          uVar9 = local_160 - uVar14;
          if (5 < uVar9) {
            __assert_fail("iVar >= 0 && iVar < 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x337,"word Abc_Tt6Cofactor0(word, int)");
          }
          local_170 = uVar14;
          bVar10 = (byte)(1 << ((byte)uVar9 & 0x1f));
          uVar14 = s_Truths6[uVar9];
          pVVar18 = (Vec_Int_t *)
                    ((s_Truths6Neg[uVar9] & local_1a0.tv_sec) << (bVar10 & 0x3f) |
                    s_Truths6Neg[uVar9] & local_1a0.tv_sec);
          uVar9 = (local_1a0.tv_sec & uVar14) >> (bVar10 & 0x3f) | local_1a0.tv_sec & uVar14;
          bVar4 = true;
          do {
            bVar2 = bVar4;
            if ((int)uVar12 < nVars) {
              if (!bVar2) {
                Dau_AddFunction((uVar9 ^ (ulong)pVVar18) & (s_Truths6[local_130] ^ uVar14) ^
                                (ulong)pVVar18,nVars,pTable,pVVar6,vNpns_);
                break;
              }
              uVar23 = s_Truths6[local_130] & uVar14;
              Dau_AddFunction((ulong)pVVar18 & ~uVar23 | uVar23 & uVar9,nVars,pTable,pVVar6,vNpns_);
              Dau_AddFunction(~uVar23 & uVar9 | uVar23 & (ulong)pVVar18,nVars,pTable,pVVar6,vNpns_);
              pVVar16 = pVVar6;
            }
            bVar4 = false;
          } while (bVar2);
          pVVar16 = (Vec_Int_t *)CONCAT71((int7)((ulong)pVVar16 >> 8),1);
          uVar23 = local_170;
          do {
            uVar24 = 0;
            local_168 = (word *)CONCAT44(local_168._4_4_,(int)pVVar16);
LAB_0051a282:
            do {
              if (uVar24 != uVar23) {
                uVar23 = s_Truths6[local_160 - uVar24];
                if (((ulong)pVVar16 & 1) == 0) {
                  Dau_AddFunction((uVar9 ^ (ulong)pVVar18) & (uVar23 ^ uVar14) ^ (ulong)pVVar18,
                                  nVars,pTable,pVVar6,vNpns_);
                  uVar24 = uVar24 + 1;
                  uVar23 = local_170;
                  if (uVar24 == uVar13) goto LAB_0051a3e6;
                  goto LAB_0051a282;
                }
                uVar21 = uVar23 & uVar14;
                Dau_AddFunction((ulong)pVVar18 & ~uVar21 | uVar21 & uVar9,nVars,pTable,pVVar6,vNpns_
                               );
                Dau_AddFunction(~uVar21 & uVar9 | uVar21 & (ulong)pVVar18,nVars,pTable,pVVar6,vNpns_
                               );
                uVar23 = ~uVar23 & uVar14;
                Dau_AddFunction((ulong)pVVar18 & ~uVar23 | uVar23 & uVar9,nVars,pTable,pVVar6,vNpns_
                               );
                pVVar16 = (Vec_Int_t *)((ulong)local_168 & 0xffffffff);
                Dau_AddFunction(~uVar23 & uVar9 | uVar23 & (ulong)pVVar18,nVars,pTable,pVVar6,vNpns_
                               );
                uVar23 = local_170;
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar13);
            uVar24 = (ulong)pVVar16 & 1;
            pVVar16 = (Vec_Int_t *)0x0;
          } while (uVar24 != 0);
LAB_0051a3e6:
          bVar4 = true;
          do {
            bVar2 = bVar4;
            local_168 = local_128;
            uVar14 = 0;
            lVar8 = local_120;
            lVar17 = local_150;
            do {
              local_118 = uVar14 + 1;
              if (uVar14 + 1 < uVar13 && uVar14 != uVar23) {
                local_110 = local_160 - uVar14;
                lVar22 = -1;
                local_100 = lVar8;
                local_108 = lVar17;
                do {
                  if (lVar17 != lVar22) {
                    uVar14 = local_168[lVar22];
                    uVar23 = s_Truths6[local_110];
                    if (bVar2) {
                      uVar24 = uVar23 & uVar14;
                      Dau_AddFunction((ulong)pVVar18 & ~uVar24 | uVar24 & uVar9,nVars,pTable,pVVar6,
                                      vNpns_);
                      Dau_AddFunction(~uVar24 & uVar9 | uVar24 & (ulong)pVVar18,nVars,pTable,pVVar6,
                                      vNpns_);
                      uVar24 = ~uVar23 & uVar14;
                      Dau_AddFunction((ulong)pVVar18 & ~uVar24 | uVar24 & uVar9,nVars,pTable,pVVar6,
                                      vNpns_);
                      Dau_AddFunction(~uVar24 & uVar9 | uVar24 & (ulong)pVVar18,nVars,pTable,pVVar6,
                                      vNpns_);
                      uVar24 = ~uVar14 & uVar23;
                      Dau_AddFunction((ulong)pVVar18 & ~uVar24 | uVar24 & uVar9,nVars,pTable,pVVar6,
                                      vNpns_);
                      Dau_AddFunction(~uVar24 & uVar9 | uVar24 & (ulong)pVVar18,nVars,pTable,pVVar6,
                                      vNpns_);
                      uVar23 = uVar23 | uVar14;
                      Dau_AddFunction(uVar23 & (ulong)pVVar18 | uVar9 & ~uVar23,nVars,pTable,pVVar6,
                                      vNpns_);
                      uVar14 = uVar23 & uVar9 | ~uVar23 & (ulong)pVVar18;
                      pVVar16 = pVVar18;
                    }
                    else {
                      uVar14 = (uVar9 ^ (ulong)pVVar18) & (uVar23 ^ uVar14) ^ (ulong)pVVar18;
                    }
                    Dau_AddFunction(uVar14,nVars,pTable,pVVar6,vNpns_);
                    lVar8 = local_100;
                    lVar17 = local_108;
                  }
                  lVar22 = lVar22 + -1;
                } while (lVar8 != lVar22);
              }
              local_168 = local_168 + -1;
              lVar17 = lVar17 + 1;
              lVar8 = lVar8 + 1;
              uVar14 = local_118;
              uVar23 = local_170;
            } while (local_118 != uVar13);
            bVar4 = false;
          } while (bVar2);
          uVar14 = local_170 + 1;
          local_150 = local_150 + -1;
        } while (uVar14 != uVar13);
        iVar5 = pVVar3->nSize;
      }
      else {
        if ((s_Truths6Neg[(int)(uVar11 - uVar15)] &
            ((ulong)local_1a0.tv_sec >> ((byte)(1 << ((byte)(uVar11 - uVar15) & 0x1f)) & 0x3f) ^
            local_1a0.tv_sec)) != 0) {
          __assert_fail("nSupp == 6 || !Abc_Tt6HasVar(uTruth, nVars-1-nSupp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                        ,0xd3,"void Dau_NetworkEnum(int)");
        }
        uVar12 = uVar15;
        if (0 < (int)uVar15) goto LAB_0051a0ff;
      }
      lVar8 = local_148 + 1;
    } while (lVar8 < iVar5);
  }
  iVar5 = 0;
  iVar26 = 0;
  iVar28 = 0;
  iVar30 = 0;
  lVar8 = 0x34;
  do {
    iVar5 = iVar5 + *(int *)((long)&local_178[-3].nCap + lVar8);
    iVar26 = iVar26 + *(int *)((long)&local_178[-2].nCap + lVar8);
    iVar28 = iVar28 + *(int *)((long)&local_178[-1].nCap + lVar8);
    iVar30 = iVar30 + *(int *)((long)&local_178->nCap + lVar8);
    lVar8 = lVar8 + 0x40;
  } while (lVar8 != 0x234);
  iVar25 = 0;
  iVar27 = 0;
  iVar29 = 0;
  iVar31 = 0;
  lVar8 = 0x34;
  do {
    iVar25 = iVar25 + *(int *)((long)&local_190[-3].nCap + lVar8);
    iVar27 = iVar27 + *(int *)((long)&local_190[-2].nCap + lVar8);
    iVar29 = iVar29 + *(int *)((long)&local_190[-1].nCap + lVar8);
    iVar31 = iVar31 + *(int *)((long)&local_190->nCap + lVar8);
    lVar8 = lVar8 + 0x40;
  } while (lVar8 != 0x234);
  printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ",local_158,
         (ulong)(uint)pVVar3[1].nSize,iVar30 + iVar26 + iVar28 + iVar5,(ulong)(uint)pVVar7[1].nSize,
         iVar31 + iVar27 + iVar29 + iVar25);
  iVar26 = 3;
  iVar5 = clock_gettime(3,&local_1a0);
  if (iVar5 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_1a0.tv_nsec / 1000 + local_1a0.tv_sec * 1000000;
  }
  lVar8 = lVar8 - local_180;
  Abc_Print(iVar26,"%s =","Time");
  Abc_Print(iVar26,"%9.2f sec\n",(double)lVar8 / 1000000.0);
  fflush(_stdout);
}

Assistant:

void Dau_NetworkEnum(int nVars)
{
    abctime clk = Abc_Clock();
    int Limit = 2;
    int UseTwo = 0;
    int nSizeLog = (1<<nVars) -2;
    int nSizeW = 1 << nSizeLog;
    char pFileName[200];
    unsigned * pTable;
    Vec_Wec_t * vNpns  = Vec_WecStart( 32 );
    Vec_Wec_t * vNpns_ = Vec_WecStart( 32 );
    int i, v, u, g, k, m, n, Res, Entry;
    unsigned Inv = (unsigned)Abc_Tt6Mask(1 << (nVars-1));
    sprintf( pFileName, "tableW%d.data", nSizeLog );
    pTable  = Dau_ReadFile( pFileName, nSizeW );
    // create constant function and buffer/inverter function
    pTable[0]   |= (1 << 31);
    pTable[Inv] |= (1 << 31);
    Vec_IntPushTwo( Vec_WecEntry(vNpns,  0), 0, Inv );
    Vec_IntPushTwo( Vec_WecEntry(vNpns_, 0), 0, Inv );
    printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ", 
        0, Vec_IntSize(Vec_WecEntry(vNpns,  0)), Vec_WecSizeSize(vNpns), 
           Vec_IntSize(Vec_WecEntry(vNpns_, 0)), Vec_WecSizeSize(vNpns_) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // numerate other functions based on how many nodes they have
    for ( n = 1; n < 32; n++ )
    {
        Vec_Int_t * vFuncsN2 = n > 1 ? Vec_WecEntry( vNpns, n-2 ) : NULL;
        Vec_Int_t * vFuncsN1 = Vec_WecEntry( vNpns, n-1 );
        Vec_Int_t * vFuncsN  = Vec_WecEntry( vNpns, n   );
        Vec_Int_t * vFuncsN_ = Vec_WecEntry( vNpns_,n   );
        Vec_IntForEachEntry( vFuncsN1, Entry, i )
        {
            word uTruth = (((word)Entry) << 32) | (word)Entry;
            int nSupp = Abc_TtSupportSize( &uTruth, nVars );
            assert( nSupp == 6 || !Abc_Tt6HasVar(uTruth, nVars-1-nSupp) );
            //printf( "Exploring function %4d with %d vars: ", i, nSupp );
            //printf( " %04x\n", (int)uTruth );
            //Dau_DsdPrintFromTruth( &uTruth, 4 );
            for ( v = 0; v < nSupp; v++ )
            {
                word tGate, tCur;
                word Cof0 = Abc_Tt6Cofactor0( uTruth, nVars-1-v );
                word Cof1 = Abc_Tt6Cofactor1( uTruth, nVars-1-v );
                for ( g = 0; g < Limit; g++ )
                {
                    if ( nSupp < nVars )
                    {
                        if ( g == 0 )
                        {
                            tGate = s_Truths6[nVars-1-v] & s_Truths6[nVars-1-nSupp];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                        else
                        {
                            tGate = s_Truths6[nVars-1-v] ^ s_Truths6[nVars-1-nSupp];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                    }
                }
                for ( g = 0; g < Limit; g++ )
                {
                    // add one cross bar
                    for ( k = 0; k < nSupp; k++ ) if ( k != v )
                    {
                        if ( g == 0 )
                        {
                            tGate = s_Truths6[nVars-1-v] & s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = s_Truths6[nVars-1-v] & ~s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                        else
                        {
                            tGate = s_Truths6[nVars-1-v] ^ s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                    }
                }
                for ( g = 0; g < Limit; g++ )
                {
                    // add two cross bars
                    for ( k = 0;   k < nSupp; k++ ) if ( k != v )
                    for ( m = k+1; m < nSupp; m++ ) if ( m != v )
                    {
                        if ( g == 0 )
                        {
                            tGate = s_Truths6[nVars-1-m] & s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = s_Truths6[nVars-1-m] & ~s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = ~s_Truths6[nVars-1-m] & s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = ~s_Truths6[nVars-1-m] & ~s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                        else
                        {
                            tGate = s_Truths6[nVars-1-m] ^ s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                    }
                }
            }
        }
        if ( UseTwo && vFuncsN2 )
        Vec_IntForEachEntry( vFuncsN2, Entry, i )
        {
            word uTruth = (((word)Entry) << 32) | (word)Entry;
            int nSupp = Abc_TtSupportSize( &uTruth, nVars );
            assert( nSupp == 6 || !Abc_Tt6HasVar(uTruth, nVars-1-nSupp) );
            //printf( "Exploring function %4d with %d vars: ", i, nSupp );
            //printf( " %04x\n", (int)uTruth );
            //Dau_DsdPrintFromTruth( &uTruth, 4 );
            for ( v = 0; v < nSupp; v++ )
//            for ( u = v+1; u < nSupp; u++ ) if ( u != v )
            for ( u = 0; u < nSupp; u++ ) if ( u != v )
            {
                word tGate1, tGate2, tCur;
                word Cof0 = Abc_Tt6Cofactor0( uTruth, nVars-1-v );
                word Cof1 = Abc_Tt6Cofactor1( uTruth, nVars-1-v );

                word Cof00 = Abc_Tt6Cofactor0( Cof0, nVars-1-u );
                word Cof01 = Abc_Tt6Cofactor1( Cof0, nVars-1-u );
                word Cof10 = Abc_Tt6Cofactor0( Cof1, nVars-1-u );
                word Cof11 = Abc_Tt6Cofactor1( Cof1, nVars-1-u );

                tGate1 = s_Truths6[nVars-1-v] & s_Truths6[nVars-1-u];
                tGate2 = s_Truths6[nVars-1-v] ^ s_Truths6[nVars-1-u];

                Cof0  = (tGate2 & Cof00) | (~tGate2 & Cof01);
                Cof1  = (tGate2 & Cof10) | (~tGate2 & Cof11);

                tCur  = (tGate1 & Cof1)  | (~tGate1 & Cof0);
                Res = Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                if ( Res )
                    printf( "Found function %d\n", Res );

                tCur  = (tGate1 & Cof0)  | (~tGate1 & Cof1);
                Res = Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                if ( Res )
                    printf( "Found function %d\n", Res );
            }
        }
        printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ", 
            n, Vec_IntSize(vFuncsN), Vec_WecSizeSize(vNpns), Vec_IntSize(vFuncsN_), Vec_WecSizeSize(vNpns_) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        fflush(stdout);
        if ( Vec_IntSize(vFuncsN) == 0 )
            break;
    }
//    printf( "Functions with 7 nodes:\n" );
//    Vec_IntForEachEntry( Vec_WecEntry(vNpns_,7), Entry, i )
//        printf( "%04x ", Entry );
//    printf( "\n" );

    Vec_WecFree( vNpns );
    Vec_WecFree( vNpns_ );
    ABC_FREE( pTable );
    Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    fflush(stdout);
}